

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O3

Iterator __thiscall
Map<int,_int>::insert(Map<int,_int> *this,Iterator *position,int *key,int *value)

{
  int iVar1;
  Iterator IVar2;
  Item *parent;
  
  parent = position->item;
  if (parent == &this->endItem) {
    parent = parent->prev;
    if ((parent != (Item *)0x0) && (parent->key < *key)) {
LAB_0010392b:
      IVar2 = insert(this,&parent->right,parent,key,value);
      return (Iterator)IVar2.item;
    }
  }
  else {
    iVar1 = *key;
    if (iVar1 < parent->key) {
      if ((parent->prev == (Item *)0x0) || (parent->prev->key < iVar1)) {
        IVar2 = insert(this,&parent->left,parent,key,value);
        return (Iterator)IVar2.item;
      }
    }
    else {
      if (iVar1 <= parent->key) {
        parent->value = *value;
        return (Iterator)parent;
      }
      if ((parent->next == &this->endItem) || (iVar1 < parent->next->key)) goto LAB_0010392b;
    }
  }
  IVar2 = insert(this,&this->root,(Item *)0x0,key,value);
  return (Iterator)IVar2.item;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Item* insertPos = position.item;
    if(insertPos == &endItem)
    {
      Item* prev = insertPos->prev;
      if(prev && key > prev->key)
        return insert(&prev->right, prev, key, value);
    }
    else
    {
      if(key < insertPos->key)
      {
        Item* prev = insertPos->prev;
        if(!prev || key > prev->key)
          return insert(&insertPos->left, insertPos, key, value);
      }
      else if(key > insertPos->key)
      {
        Item* next = insertPos->next;
        if(next == &endItem || key < next->key)
          return insert(&insertPos->right, insertPos, key, value);
      }
      else
      {
        insertPos->value = value;
        return insertPos;
      }
    }
    return insert(&root, 0, key, value);
  }